

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest9::verifyXFBData(FunctionalTest9 *this,GLvoid *data_ptr)

{
  ostringstream *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  uint n_component;
  long lVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec4 expected_result;
  float local_1c0 [4];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if (this->m_n_points_to_draw != 0) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    uVar6 = 0;
    bVar4 = true;
    do {
      local_1c0[0] = 0.0;
      local_1c0[1] = 1.0;
      local_1c0[2] = 2.0;
      local_1c0[3] = 3.0;
      lVar5 = 0;
      do {
        local_1c0[lVar5] = local_1c0[lVar5] + (float)uVar6 + 0.123;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      fVar1 = local_1c0[0];
      fVar2 = local_1c0[1];
      fVar3 = local_1c0[2];
      fVar7 = local_1c0[0] + local_1c0[1] + local_1c0[2] + local_1c0[3];
      local_1c0[3] = fVar7;
      fVar8 = local_1c0[0] - *data_ptr;
      fVar9 = -fVar8;
      if (-fVar8 <= fVar8) {
        fVar9 = fVar8;
      }
      if (1e-05 < fVar9) {
LAB_0097fecf:
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"XFBed data is invalid. Expected:(",0x21);
        std::ostream::_M_insert<double>((double)fVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)fVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)fVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)fVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"), found:(",10);
        std::ostream::_M_insert<double>((double)*data_ptr);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)*(float *)((long)data_ptr + 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)*(float *)((long)data_ptr + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)*(float *)((long)data_ptr + 0xc));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,").",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        this->m_has_test_passed = false;
        bVar4 = false;
      }
      else {
        fVar8 = local_1c0[1] - *(float *)((long)data_ptr + 4);
        fVar9 = -fVar8;
        if (-fVar8 <= fVar8) {
          fVar9 = fVar8;
        }
        if (1e-05 < fVar9) goto LAB_0097fecf;
        fVar8 = local_1c0[2] - *(float *)((long)data_ptr + 8);
        fVar9 = -fVar8;
        if (-fVar8 <= fVar8) {
          fVar9 = fVar8;
        }
        if (1e-05 < fVar9) goto LAB_0097fecf;
        fVar8 = fVar7 - *(float *)((long)data_ptr + 0xc);
        fVar9 = -fVar8;
        if (-fVar8 <= fVar8) {
          fVar9 = fVar8;
        }
        if (1e-05 < fVar9) goto LAB_0097fecf;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar6 < this->m_n_points_to_draw) &&
            (data_ptr = (GLvoid *)((long)data_ptr + 0x10), bVar4));
  }
  return;
}

Assistant:

void FunctionalTest9::verifyXFBData(const glw::GLvoid* data_ptr)
{
	const float			epsilon			= 1e-5f;
	bool				should_continue = true;
	const glw::GLfloat* traveller_ptr   = (const glw::GLfloat*)data_ptr;

	for (unsigned int n_point = 0; n_point < m_n_points_to_draw && should_continue; ++n_point)
	{
		tcu::Vec4 expected_result(0, 1, 2, 3);

		for (unsigned int n_component = 0; n_component < 3 /* xyz */; ++n_component)
		{
			expected_result[n_component] += 0.123f + float(n_point);
		}

		expected_result[3 /* w */] += expected_result[0] + expected_result[1] + expected_result[2];

		if (de::abs(expected_result[0] - traveller_ptr[0]) > epsilon ||
			de::abs(expected_result[1] - traveller_ptr[1]) > epsilon ||
			de::abs(expected_result[2] - traveller_ptr[2]) > epsilon ||
			de::abs(expected_result[3] - traveller_ptr[3]) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "XFBed data is invalid. Expected:"
														   "("
							   << expected_result[0] << ", " << expected_result[1] << ", " << expected_result[2] << ", "
							   << expected_result[3] << "), found:(" << traveller_ptr[0] << ", " << traveller_ptr[1]
							   << ", " << traveller_ptr[2] << ", " << traveller_ptr[3] << ")."
							   << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
			should_continue   = false;
		}

		traveller_ptr += 4; /* xyzw */
	}						/* for (all rendered points) */
}